

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  Mat *pMVar1;
  Mat *pMVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  int *piVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  int iVar12;
  pointer ppLVar13;
  void *pvVar14;
  Layer *pLVar15;
  Option *pOVar16;
  pointer ppLVar17;
  Allocator *pAVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar27;
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  Mat int8_weight_data;
  Mat weight_data_g;
  Mat int8_weight_data_g;
  Option opt;
  ParamDict pd;
  undefined1 local_628 [24];
  Allocator *pAStack_610;
  undefined1 local_608 [16];
  size_t local_5f8;
  Mat *local_5f0;
  ModelBinFromMatArray local_5e8;
  size_t local_5d8;
  Allocator *local_5d0;
  undefined1 local_5c8 [16];
  long local_5b8;
  undefined1 local_5a8 [16];
  size_t local_598;
  Allocator *local_590;
  undefined1 local_588 [16];
  long local_578;
  undefined8 local_568;
  Allocator *pAStack_560;
  Allocator *local_558;
  undefined1 local_548 [8];
  int *piStack_540;
  size_t local_538;
  Allocator *local_530;
  undefined1 local_528 [16];
  Allocator *local_518 [157];
  
  (**mb->_vptr_ModelBin)(local_548,mb,(ulong)(uint)this->weight_data_size,0);
  local_5f0 = &this->weight_data;
  if (local_5f0 != (Mat *)local_548) {
    if (piStack_540 != (int *)0x0) {
      LOCK();
      *piStack_540 = *piStack_540 + 1;
      UNLOCK();
    }
    piVar6 = (this->weight_data).refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        pvVar14 = (this->weight_data).data;
        pAVar18 = (this->weight_data).allocator;
        if (pAVar18 == (Allocator *)0x0) {
          if (pvVar14 != (void *)0x0) {
            free(*(void **)((long)pvVar14 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar18 + 8))();
        }
      }
    }
    local_5f0->data = (void *)0x0;
    local_5f0->refcount = (int *)0x0;
    local_5f0->elemsize = 0;
    (this->weight_data).cstep = 0;
    (this->weight_data).dims = 0;
    (this->weight_data).w = 0;
    (this->weight_data).h = 0;
    (this->weight_data).c = 0;
    (this->weight_data).data = (void *)local_548;
    (this->weight_data).refcount = piStack_540;
    (this->weight_data).elemsize = local_538;
    (this->weight_data).allocator = local_530;
    (this->weight_data).dims = local_528._0_4_;
    (this->weight_data).w = local_528._4_4_;
    (this->weight_data).h = local_528._8_4_;
    (this->weight_data).c = local_528._12_4_;
    (this->weight_data).cstep = (size_t)local_518[0];
  }
  if (piStack_540 != (int *)0x0) {
    LOCK();
    *piStack_540 = *piStack_540 + -1;
    UNLOCK();
    if (*piStack_540 == 0) {
      if (local_530 == (Allocator *)0x0) {
        if (local_548 != (undefined1  [8])0x0) {
          free(*(void **)((long)local_548 + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_530 + 8))();
      }
    }
  }
  iVar12 = -100;
  if ((local_5f0->data != (void *)0x0) &&
     ((long)(this->weight_data).c * (this->weight_data).cstep != 0)) {
    if (this->bias_term != 0) {
      (**mb->_vptr_ModelBin)(local_548,mb,(ulong)(uint)this->num_output,1);
      pMVar1 = &this->bias_data;
      if (pMVar1 != (Mat *)local_548) {
        if (piStack_540 != (int *)0x0) {
          LOCK();
          *piStack_540 = *piStack_540 + 1;
          UNLOCK();
        }
        piVar6 = (this->bias_data).refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pvVar14 = (this->bias_data).data;
            pAVar18 = (this->bias_data).allocator;
            if (pAVar18 == (Allocator *)0x0) {
              if (pvVar14 != (void *)0x0) {
                free(*(void **)((long)pvVar14 + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar18 + 8))();
            }
          }
        }
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        (this->bias_data).elemsize = 0;
        (this->bias_data).cstep = 0;
        (this->bias_data).dims = 0;
        (this->bias_data).w = 0;
        (this->bias_data).h = 0;
        (this->bias_data).c = 0;
        (this->bias_data).data = (void *)local_548;
        (this->bias_data).refcount = piStack_540;
        (this->bias_data).elemsize = local_538;
        (this->bias_data).allocator = local_530;
        (this->bias_data).dims = local_528._0_4_;
        (this->bias_data).w = local_528._4_4_;
        (this->bias_data).h = local_528._8_4_;
        (this->bias_data).c = local_528._12_4_;
        (this->bias_data).cstep = (size_t)local_518[0];
      }
      if (piStack_540 != (int *)0x0) {
        LOCK();
        *piStack_540 = *piStack_540 + -1;
        UNLOCK();
        if (*piStack_540 == 0) {
          if (local_530 == (Allocator *)0x0) {
            if (local_548 != (undefined1  [8])0x0) {
              free(*(void **)((long)local_548 + -8));
            }
          }
          else {
            (**(code **)(*(long *)local_530 + 8))();
          }
        }
      }
      if (pMVar1->data == (void *)0x0) {
        return -100;
      }
      if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
        return -100;
      }
    }
    if (this->int8_scale_term == 2) {
      (**mb->_vptr_ModelBin)(local_548,mb,1,1);
      pMVar1 = &this->weight_data_int8_scales;
      if (pMVar1 != (Mat *)local_548) {
        if (piStack_540 != (int *)0x0) {
          LOCK();
          *piStack_540 = *piStack_540 + 1;
          UNLOCK();
        }
        piVar6 = (this->weight_data_int8_scales).refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pvVar14 = (this->weight_data_int8_scales).data;
            pAVar18 = (this->weight_data_int8_scales).allocator;
            if (pAVar18 == (Allocator *)0x0) {
              if (pvVar14 != (void *)0x0) {
                free(*(void **)((long)pvVar14 + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar18 + 8))();
            }
          }
        }
        auVar8 = local_528;
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        (this->weight_data_int8_scales).elemsize = 0;
        (this->weight_data_int8_scales).cstep = 0;
        (this->weight_data_int8_scales).dims = 0;
        (this->weight_data_int8_scales).w = 0;
        (this->weight_data_int8_scales).h = 0;
        (this->weight_data_int8_scales).c = 0;
        (this->weight_data_int8_scales).data = (void *)local_548;
        (this->weight_data_int8_scales).refcount = piStack_540;
        (this->weight_data_int8_scales).elemsize = local_538;
        (this->weight_data_int8_scales).allocator = local_530;
        (this->weight_data_int8_scales).dims = local_528._0_4_;
        (this->weight_data_int8_scales).w = local_528._4_4_;
        (this->weight_data_int8_scales).h = local_528._8_4_;
        (this->weight_data_int8_scales).c = local_528._12_4_;
        (this->weight_data_int8_scales).cstep = (size_t)local_518[0];
        local_528 = auVar8;
      }
      if (piStack_540 != (int *)0x0) {
        LOCK();
        *piStack_540 = *piStack_540 + -1;
        UNLOCK();
        if (*piStack_540 == 0) {
          if (local_530 == (Allocator *)0x0) {
            if (local_548 != (undefined1  [8])0x0) {
              free(*(void **)((long)local_548 + -8));
            }
          }
          else {
            (**(code **)(*(long *)local_530 + 8))();
          }
        }
      }
      (**mb->_vptr_ModelBin)(local_548,mb,1,1);
      pMVar2 = &this->bottom_blob_int8_scales;
      if (pMVar2 != (Mat *)local_548) {
        if (piStack_540 != (int *)0x0) {
          LOCK();
          *piStack_540 = *piStack_540 + 1;
          UNLOCK();
        }
        piVar6 = (this->bottom_blob_int8_scales).refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pvVar14 = (this->bottom_blob_int8_scales).data;
            pAVar18 = (this->bottom_blob_int8_scales).allocator;
            if (pAVar18 == (Allocator *)0x0) {
              if (pvVar14 != (void *)0x0) {
                free(*(void **)((long)pvVar14 + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar18 + 8))();
            }
          }
        }
        pMVar2->data = (void *)0x0;
        pMVar2->refcount = (int *)0x0;
        (this->bottom_blob_int8_scales).elemsize = 0;
        (this->bottom_blob_int8_scales).cstep = 0;
        (this->bottom_blob_int8_scales).dims = 0;
        (this->bottom_blob_int8_scales).w = 0;
        (this->bottom_blob_int8_scales).h = 0;
        (this->bottom_blob_int8_scales).c = 0;
        (this->bottom_blob_int8_scales).data = (void *)local_548;
        (this->bottom_blob_int8_scales).refcount = piStack_540;
        (this->bottom_blob_int8_scales).elemsize = local_538;
        (this->bottom_blob_int8_scales).allocator = local_530;
        (this->bottom_blob_int8_scales).dims = local_528._0_4_;
        (this->bottom_blob_int8_scales).w = local_528._4_4_;
        (this->bottom_blob_int8_scales).h = local_528._8_4_;
        (this->bottom_blob_int8_scales).c = local_528._12_4_;
        (this->bottom_blob_int8_scales).cstep = (size_t)local_518[0];
      }
      if (piStack_540 != (int *)0x0) {
        LOCK();
        *piStack_540 = *piStack_540 + -1;
        UNLOCK();
        if (*piStack_540 == 0) {
          if (local_530 == (Allocator *)0x0) {
            if (local_548 != (undefined1  [8])0x0) {
              free(*(void **)((long)local_548 + -8));
            }
          }
          else {
            (**(code **)(*(long *)local_530 + 8))();
          }
        }
      }
      uVar3 = *(this->weight_data_int8_scales).data;
      local_528._4_4_ = this->group;
      pAVar18 = (Allocator *)(long)(int)local_528._4_4_;
      local_548 = (undefined1  [8])0x0;
      piStack_540 = (int *)0x0;
      local_538 = 4;
      local_530 = (Allocator *)0x0;
      local_528._0_4_ = 1;
      local_528._8_8_ = 0x100000001;
      local_518[0] = pAVar18;
      if (local_528._4_4_ != 0) {
        pvVar14 = malloc((long)pAVar18 * 4 + 0x1c);
        local_548 = (undefined1  [8])((long)pvVar14 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)local_548 - 8) = pvVar14;
        piStack_540 = (int *)((long)local_548 + (long)pAVar18 * 4);
        *piStack_540 = 1;
      }
      if (pMVar1 != (Mat *)local_548) {
        if (piStack_540 != (int *)0x0) {
          LOCK();
          *piStack_540 = *piStack_540 + 1;
          UNLOCK();
        }
        piVar6 = (this->weight_data_int8_scales).refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pvVar14 = (this->weight_data_int8_scales).data;
            pAVar18 = (this->weight_data_int8_scales).allocator;
            if (pAVar18 == (Allocator *)0x0) {
              if (pvVar14 != (void *)0x0) {
                free(*(void **)((long)pvVar14 + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar18 + 8))();
            }
          }
        }
        auVar8 = local_528;
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        (this->weight_data_int8_scales).elemsize = 0;
        (this->weight_data_int8_scales).cstep = 0;
        (this->weight_data_int8_scales).dims = 0;
        (this->weight_data_int8_scales).w = 0;
        (this->weight_data_int8_scales).h = 0;
        (this->weight_data_int8_scales).c = 0;
        (this->weight_data_int8_scales).data = (void *)local_548;
        (this->weight_data_int8_scales).refcount = piStack_540;
        (this->weight_data_int8_scales).elemsize = local_538;
        (this->weight_data_int8_scales).allocator = local_530;
        (this->weight_data_int8_scales).dims = local_528._0_4_;
        (this->weight_data_int8_scales).w = local_528._4_4_;
        (this->weight_data_int8_scales).h = local_528._8_4_;
        (this->weight_data_int8_scales).c = local_528._12_4_;
        (this->weight_data_int8_scales).cstep = (size_t)local_518[0];
        local_528 = auVar8;
      }
      if (piStack_540 != (int *)0x0) {
        LOCK();
        *piStack_540 = *piStack_540 + -1;
        UNLOCK();
        if (*piStack_540 == 0) {
          if (local_530 == (Allocator *)0x0) {
            if (local_548 != (undefined1  [8])0x0) {
              free(*(void **)((long)local_548 - 8));
            }
          }
          else {
            (**(code **)(*(long *)local_530 + 8))();
          }
        }
      }
      auVar10 = _DAT_001394c0;
      auVar9 = _DAT_001394b0;
      auVar8 = _DAT_00139440;
      uVar11 = (this->weight_data_int8_scales).c * (int)(this->weight_data_int8_scales).cstep;
      if (0 < (int)uVar11) {
        pvVar14 = pMVar1->data;
        lVar20 = (ulong)uVar11 - 1;
        auVar24._8_4_ = (int)lVar20;
        auVar24._0_8_ = lVar20;
        auVar24._12_4_ = (int)((ulong)lVar20 >> 0x20);
        uVar21 = 0;
        auVar24 = auVar24 ^ _DAT_00139440;
        do {
          auVar26._8_4_ = (int)uVar21;
          auVar26._0_8_ = uVar21;
          auVar26._12_4_ = (int)(uVar21 >> 0x20);
          auVar28 = (auVar26 | auVar10) ^ auVar8;
          iVar12 = auVar24._4_4_;
          if ((bool)(~(auVar28._4_4_ == iVar12 && auVar24._0_4_ < auVar28._0_4_ ||
                      iVar12 < auVar28._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar14 + uVar21 * 4) = uVar3;
          }
          if ((auVar28._12_4_ != auVar24._12_4_ || auVar28._8_4_ <= auVar24._8_4_) &&
              auVar28._12_4_ <= auVar24._12_4_) {
            *(undefined4 *)((long)pvVar14 + uVar21 * 4 + 4) = uVar3;
          }
          auVar26 = (auVar26 | auVar9) ^ auVar8;
          iVar27 = auVar26._4_4_;
          if (iVar27 <= iVar12 && (iVar27 != iVar12 || auVar26._0_4_ <= auVar24._0_4_)) {
            *(undefined4 *)((long)pvVar14 + uVar21 * 4 + 8) = uVar3;
            *(undefined4 *)((long)pvVar14 + uVar21 * 4 + 0xc) = uVar3;
          }
          uVar21 = uVar21 + 4;
        } while ((uVar11 + 3 & 0xfffffffc) != uVar21);
      }
      uVar3 = *(this->bottom_blob_int8_scales).data;
      local_528._4_4_ = this->group;
      pAVar18 = (Allocator *)(long)(int)local_528._4_4_;
      local_548 = (undefined1  [8])0x0;
      piStack_540 = (int *)0x0;
      local_538 = 4;
      local_530 = (Allocator *)0x0;
      local_528._0_4_ = 1;
      local_528._8_8_ = 0x100000001;
      local_518[0] = pAVar18;
      if (local_528._4_4_ != 0) {
        pvVar14 = malloc((long)pAVar18 * 4 + 0x1c);
        local_548 = (undefined1  [8])((long)pvVar14 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)local_548 - 8) = pvVar14;
        piStack_540 = (int *)((long)local_548 + (long)pAVar18 * 4);
        *piStack_540 = 1;
      }
      if (pMVar2 != (Mat *)local_548) {
        if (piStack_540 != (int *)0x0) {
          LOCK();
          *piStack_540 = *piStack_540 + 1;
          UNLOCK();
        }
        piVar6 = (this->bottom_blob_int8_scales).refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pvVar14 = (this->bottom_blob_int8_scales).data;
            pAVar18 = (this->bottom_blob_int8_scales).allocator;
            if (pAVar18 == (Allocator *)0x0) {
              if (pvVar14 != (void *)0x0) {
                free(*(void **)((long)pvVar14 + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar18 + 8))();
            }
          }
        }
        auVar8 = local_528;
        pMVar2->data = (void *)0x0;
        pMVar2->refcount = (int *)0x0;
        (this->bottom_blob_int8_scales).elemsize = 0;
        (this->bottom_blob_int8_scales).cstep = 0;
        (this->bottom_blob_int8_scales).dims = 0;
        (this->bottom_blob_int8_scales).w = 0;
        (this->bottom_blob_int8_scales).h = 0;
        (this->bottom_blob_int8_scales).c = 0;
        (this->bottom_blob_int8_scales).data = (void *)local_548;
        (this->bottom_blob_int8_scales).refcount = piStack_540;
        (this->bottom_blob_int8_scales).elemsize = local_538;
        (this->bottom_blob_int8_scales).allocator = local_530;
        (this->bottom_blob_int8_scales).dims = local_528._0_4_;
        (this->bottom_blob_int8_scales).w = local_528._4_4_;
        (this->bottom_blob_int8_scales).h = local_528._8_4_;
        (this->bottom_blob_int8_scales).c = local_528._12_4_;
        (this->bottom_blob_int8_scales).cstep = (size_t)local_518[0];
        local_528 = auVar8;
      }
      if (piStack_540 != (int *)0x0) {
        LOCK();
        *piStack_540 = *piStack_540 + -1;
        UNLOCK();
        if (*piStack_540 == 0) {
          if (local_530 == (Allocator *)0x0) {
            if (local_548 != (undefined1  [8])0x0) {
              free(*(void **)((long)local_548 - 8));
            }
          }
          else {
            (**(code **)(*(long *)local_530 + 8))();
          }
        }
      }
      auVar10 = _DAT_001394c0;
      auVar9 = _DAT_001394b0;
      auVar8 = _DAT_00139440;
      _local_548 = (undefined1  [16])0x0;
      local_538 = 0;
      local_518[0] = (Allocator *)0x0;
      local_528 = (undefined1  [16])0x0;
      uVar11 = (this->bottom_blob_int8_scales).c * (int)(this->bottom_blob_int8_scales).cstep;
      if (0 < (int)uVar11) {
        pvVar14 = pMVar2->data;
        lVar20 = (ulong)uVar11 - 1;
        auVar28._8_4_ = (int)lVar20;
        auVar28._0_8_ = lVar20;
        auVar28._12_4_ = (int)((ulong)lVar20 >> 0x20);
        uVar21 = 0;
        auVar28 = auVar28 ^ _DAT_00139440;
        do {
          auVar25._8_4_ = (int)uVar21;
          auVar25._0_8_ = uVar21;
          auVar25._12_4_ = (int)(uVar21 >> 0x20);
          auVar24 = (auVar25 | auVar10) ^ auVar8;
          iVar12 = auVar28._4_4_;
          if ((bool)(~(auVar24._4_4_ == iVar12 && auVar28._0_4_ < auVar24._0_4_ ||
                      iVar12 < auVar24._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar14 + uVar21 * 4) = uVar3;
          }
          if ((auVar24._12_4_ != auVar28._12_4_ || auVar24._8_4_ <= auVar28._8_4_) &&
              auVar24._12_4_ <= auVar28._12_4_) {
            *(undefined4 *)((long)pvVar14 + uVar21 * 4 + 4) = uVar3;
          }
          auVar24 = (auVar25 | auVar9) ^ auVar8;
          iVar27 = auVar24._4_4_;
          if (iVar27 <= iVar12 && (iVar27 != iVar12 || auVar24._0_4_ <= auVar28._0_4_)) {
            *(undefined4 *)((long)pvVar14 + uVar21 * 4 + 8) = uVar3;
            *(undefined4 *)((long)pvVar14 + uVar21 * 4 + 0xc) = uVar3;
          }
          uVar21 = uVar21 + 4;
        } while ((uVar11 + 3 & 0xfffffffc) != uVar21);
      }
    }
    else if (this->int8_scale_term == 1) {
      (**mb->_vptr_ModelBin)(local_548,mb,(ulong)(uint)this->group,1);
      pMVar1 = &this->weight_data_int8_scales;
      if (pMVar1 != (Mat *)local_548) {
        if (piStack_540 != (int *)0x0) {
          LOCK();
          *piStack_540 = *piStack_540 + 1;
          UNLOCK();
        }
        piVar6 = (this->weight_data_int8_scales).refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pvVar14 = (this->weight_data_int8_scales).data;
            pAVar18 = (this->weight_data_int8_scales).allocator;
            if (pAVar18 == (Allocator *)0x0) {
              if (pvVar14 != (void *)0x0) {
                free(*(void **)((long)pvVar14 + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar18 + 8))();
            }
          }
        }
        auVar8 = local_528;
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        (this->weight_data_int8_scales).elemsize = 0;
        (this->weight_data_int8_scales).cstep = 0;
        (this->weight_data_int8_scales).dims = 0;
        (this->weight_data_int8_scales).w = 0;
        (this->weight_data_int8_scales).h = 0;
        (this->weight_data_int8_scales).c = 0;
        (this->weight_data_int8_scales).data = (void *)local_548;
        (this->weight_data_int8_scales).refcount = piStack_540;
        (this->weight_data_int8_scales).elemsize = local_538;
        (this->weight_data_int8_scales).allocator = local_530;
        (this->weight_data_int8_scales).dims = local_528._0_4_;
        (this->weight_data_int8_scales).w = local_528._4_4_;
        (this->weight_data_int8_scales).h = local_528._8_4_;
        (this->weight_data_int8_scales).c = local_528._12_4_;
        (this->weight_data_int8_scales).cstep = (size_t)local_518[0];
        local_528 = auVar8;
      }
      if (piStack_540 != (int *)0x0) {
        LOCK();
        *piStack_540 = *piStack_540 + -1;
        UNLOCK();
        if (*piStack_540 == 0) {
          if (local_530 == (Allocator *)0x0) {
            if (local_548 != (undefined1  [8])0x0) {
              free(*(void **)((long)local_548 + -8));
            }
          }
          else {
            (**(code **)(*(long *)local_530 + 8))();
          }
        }
      }
      (**mb->_vptr_ModelBin)(local_548,mb,(ulong)(uint)this->group,1);
      pMVar1 = &this->bottom_blob_int8_scales;
      if (pMVar1 != (Mat *)local_548) {
        if (piStack_540 != (int *)0x0) {
          LOCK();
          *piStack_540 = *piStack_540 + 1;
          UNLOCK();
        }
        piVar6 = (this->bottom_blob_int8_scales).refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pvVar14 = (this->bottom_blob_int8_scales).data;
            pAVar18 = (this->bottom_blob_int8_scales).allocator;
            if (pAVar18 == (Allocator *)0x0) {
              if (pvVar14 != (void *)0x0) {
                free(*(void **)((long)pvVar14 + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar18 + 8))();
            }
          }
        }
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        (this->bottom_blob_int8_scales).elemsize = 0;
        (this->bottom_blob_int8_scales).cstep = 0;
        (this->bottom_blob_int8_scales).dims = 0;
        (this->bottom_blob_int8_scales).w = 0;
        (this->bottom_blob_int8_scales).h = 0;
        (this->bottom_blob_int8_scales).c = 0;
        (this->bottom_blob_int8_scales).data = (void *)local_548;
        (this->bottom_blob_int8_scales).refcount = piStack_540;
        (this->bottom_blob_int8_scales).elemsize = local_538;
        (this->bottom_blob_int8_scales).allocator = local_530;
        (this->bottom_blob_int8_scales).dims = local_528._0_4_;
        (this->bottom_blob_int8_scales).w = local_528._4_4_;
        (this->bottom_blob_int8_scales).h = local_528._8_4_;
        (this->bottom_blob_int8_scales).c = local_528._12_4_;
        (this->bottom_blob_int8_scales).cstep = (size_t)local_518[0];
      }
      if (piStack_540 != (int *)0x0) {
        LOCK();
        *piStack_540 = *piStack_540 + -1;
        UNLOCK();
        if (*piStack_540 == 0) {
          if (local_530 == (Allocator *)0x0) {
            if (local_548 != (undefined1  [8])0x0) {
              free(*(void **)((long)local_548 + -8));
            }
          }
          else {
            (**(code **)(*(long *)local_530 + 8))();
          }
        }
      }
    }
    ppLVar13 = (this->quantize_ops).
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppLVar17 = (this->quantize_ops).
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (0 < (int)((ulong)((long)ppLVar17 - (long)ppLVar13) >> 3)) {
      lVar20 = 0;
      do {
        if (ppLVar13[lVar20] != (Layer *)0x0) {
          (*ppLVar13[lVar20]->_vptr_Layer[1])();
        }
        lVar20 = lVar20 + 1;
        ppLVar13 = (this->quantize_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppLVar17 = (this->quantize_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      } while (lVar20 < (int)((ulong)((long)ppLVar17 - (long)ppLVar13) >> 3));
    }
    if (ppLVar17 != ppLVar13) {
      (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
      .super__Vector_impl_data._M_finish = ppLVar13;
    }
    ppLVar13 = (this->dequantize_ops).
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppLVar17 = (this->dequantize_ops).
               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (0 < (int)((ulong)((long)ppLVar17 - (long)ppLVar13) >> 3)) {
      lVar20 = 0;
      do {
        if (ppLVar13[lVar20] != (Layer *)0x0) {
          (*ppLVar13[lVar20]->_vptr_Layer[1])();
        }
        lVar20 = lVar20 + 1;
        ppLVar13 = (this->dequantize_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppLVar17 = (this->dequantize_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      } while (lVar20 < (int)((ulong)((long)ppLVar17 - (long)ppLVar13) >> 3));
    }
    if (ppLVar17 != ppLVar13) {
      (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppLVar13;
    }
    sVar7 = (this->weight_data).elemsize;
    if ((sVar7 == 1) && (this->use_int8_inference == false)) {
      load_model();
      iVar12 = -1;
    }
    else {
      if ((sVar7 == 4) && (this->use_int8_inference == true)) {
        local_608._4_4_ = this->weight_data_size;
        local_5f8 = (size_t)(int)local_608._4_4_;
        local_628._0_8_ = (void *)0x0;
        local_628._8_8_ = (int *)0x0;
        stack0xfffffffffffff9e8 = ZEXT816(1);
        local_608._0_4_ = 1;
        local_608._8_8_ = 0x100000001;
        if (local_608._4_4_ != 0) {
          uVar21 = local_5f8 + 3 & 0xfffffffffffffffc;
          pvVar14 = malloc(uVar21 + 0x1c);
          local_628._0_8_ = (long)pvVar14 + 0x17U & 0xfffffffffffffff0;
          *(void **)(local_628._0_8_ - 8) = pvVar14;
          local_628._8_8_ = local_628._0_8_ + uVar21;
          *(undefined4 *)(local_628._0_8_ + uVar21) = 1;
        }
        if ((void *)local_628._0_8_ == (void *)0x0) {
          bVar23 = true;
        }
        else {
          bVar23 = (long)(int)local_608._12_4_ * local_5f8 == 0;
        }
        if (bVar23) {
          if ((int *)local_628._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_628._8_8_ = *(int *)local_628._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_628._8_8_ == 0) {
              if (pAStack_610 == (Allocator *)0x0) {
                if ((void *)local_628._0_8_ != (void *)0x0) {
                  free(*(void **)(local_628._0_8_ - 8));
                }
              }
              else {
                (**(code **)(*(long *)pAStack_610 + 8))();
              }
            }
          }
          return -100;
        }
        iVar12 = this->weight_data_size / this->group;
        if (0 < this->group) {
          lVar20 = (long)iVar12;
          lVar22 = 0;
          do {
            pLVar15 = create_layer(0x39);
            ParamDict::ParamDict((ParamDict *)local_548);
            ParamDict::set((ParamDict *)local_548,0,
                           *(float *)((long)(this->weight_data_int8_scales).data + lVar22 * 4));
            (*pLVar15->_vptr_Layer[2])(pLVar15,(ParamDict *)local_548);
            pOVar16 = get_default_option();
            local_568._0_1_ = pOVar16->lightmode;
            local_568._1_3_ = *(undefined3 *)&pOVar16->field_0x1;
            local_568._4_4_ = pOVar16->num_threads;
            local_558 = pOVar16->workspace_allocator;
            pAStack_560 = pAStack_610;
            local_5d8 = (this->weight_data).elemsize;
            local_5d0 = (this->weight_data).allocator;
            local_5e8.weights = (Mat *)0x0;
            local_5e8.super_ModelBin._vptr_ModelBin =
                 (_func_int **)(local_5d8 * lVar22 * lVar20 + (long)(this->weight_data).data);
            local_5c8._4_4_ = iVar12;
            local_5c8._0_4_ = 1;
            local_5c8._8_8_ = 0x100000001;
            local_5a8._8_8_ = 0;
            local_5a8._0_8_ = (void *)(lVar22 * lVar20 * local_628._16_8_ + local_628._0_8_);
            local_598 = local_628._16_8_;
            local_590 = pAStack_610;
            local_588._4_4_ = iVar12;
            local_588._0_4_ = 1;
            local_588._8_8_ = 0x100000001;
            local_5b8 = lVar20;
            local_578 = lVar20;
            (*pLVar15->_vptr_Layer[5])(pLVar15,&local_5e8,local_5a8,&local_568);
            (*pLVar15->_vptr_Layer[1])(pLVar15);
            if ((int *)local_5a8._8_8_ != (int *)0x0) {
              LOCK();
              *(int *)local_5a8._8_8_ = *(int *)local_5a8._8_8_ + -1;
              UNLOCK();
              if (*(int *)local_5a8._8_8_ == 0) {
                if (local_590 == (Allocator *)0x0) {
                  if (local_5a8._0_8_ != 0) {
                    free(*(void **)(local_5a8._0_8_ + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)local_590 + 8))();
                }
              }
            }
            local_5a8 = (undefined1  [16])0x0;
            local_598 = 0;
            local_578 = 0;
            local_588 = (undefined1  [16])0x0;
            if (local_5e8.weights != (Mat *)0x0) {
              LOCK();
              *(int *)&(local_5e8.weights)->data = *(int *)&(local_5e8.weights)->data + -1;
              UNLOCK();
              if (*(int *)&(local_5e8.weights)->data == 0) {
                if (local_5d0 == (Allocator *)0x0) {
                  if (local_5e8.super_ModelBin._vptr_ModelBin != (_func_int **)0x0) {
                    free(local_5e8.super_ModelBin._vptr_ModelBin[-1]);
                  }
                }
                else {
                  (**(code **)(*(long *)local_5d0 + 8))();
                }
              }
            }
            local_5e8.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
            local_5e8.weights = (Mat *)0x0;
            local_5d8 = 0;
            local_5b8 = 0;
            local_5c8 = (undefined1  [16])0x0;
            lVar19 = 0x4d8;
            do {
              piVar6 = *(int **)(local_548 + lVar19 + 8);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (*(long **)(local_528 + lVar19 + -8) == (long *)0x0) {
                    if (*(long *)(local_548 + lVar19) != 0) {
                      free(*(void **)(*(long *)(local_548 + lVar19) + -8));
                    }
                  }
                  else {
                    (**(code **)(**(long **)(local_528 + lVar19 + -8) + 8))();
                  }
                }
              }
              *(undefined1 (*) [16])(local_548 + lVar19) = (undefined1  [16])0x0;
              *(undefined8 *)((long)&local_538 + lVar19) = 0;
              *(undefined8 *)((long)local_518 + lVar19) = 0;
              *(undefined1 (*) [16])(local_528 + lVar19) = (undefined1  [16])0x0;
              lVar19 = lVar19 + -0x40;
            } while (lVar19 != -0x28);
            lVar22 = lVar22 + 1;
          } while (lVar22 < this->group);
        }
        if (local_5f0 != (Mat *)local_628) {
          if ((int *)local_628._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_628._8_8_ = *(int *)local_628._8_8_ + 1;
            UNLOCK();
          }
          piVar6 = (this->weight_data).refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pvVar14 = (this->weight_data).data;
              pAVar18 = (this->weight_data).allocator;
              if (pAVar18 == (Allocator *)0x0) {
                if (pvVar14 != (void *)0x0) {
                  free(*(void **)((long)pvVar14 + -8));
                }
              }
              else {
                (**(code **)(*(long *)pAVar18 + 8))();
              }
            }
          }
          auVar8 = local_608;
          local_5f0->data = (void *)0x0;
          local_5f0->refcount = (int *)0x0;
          local_5f0->elemsize = 0;
          (this->weight_data).cstep = 0;
          (this->weight_data).dims = 0;
          (this->weight_data).w = 0;
          (this->weight_data).h = 0;
          (this->weight_data).c = 0;
          (this->weight_data).data = (void *)local_628._0_8_;
          (this->weight_data).refcount = (int *)local_628._8_8_;
          (this->weight_data).elemsize = local_628._16_8_;
          (this->weight_data).allocator = pAStack_610;
          (this->weight_data).dims = local_608._0_4_;
          (this->weight_data).w = local_608._4_4_;
          (this->weight_data).h = local_608._8_4_;
          (this->weight_data).c = local_608._12_4_;
          (this->weight_data).cstep = local_5f8;
          local_608 = auVar8;
        }
        if ((int *)local_628._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_628._8_8_ = *(int *)local_628._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_628._8_8_ == 0) {
            if (pAStack_610 == (Allocator *)0x0) {
              if ((void *)local_628._0_8_ != (void *)0x0) {
                free(*(void **)(local_628._0_8_ - 8));
              }
            }
            else {
              (**(code **)(*(long *)pAStack_610 + 8))();
            }
          }
        }
        local_628._0_16_ = (undefined1  [16])0x0;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = pAStack_610;
        stack0xfffffffffffff9e8 = auVar8 << 0x40;
        local_5f8 = 0;
        local_608 = (undefined1  [16])0x0;
        if (bVar23) {
          return -100;
        }
      }
      iVar12 = 0;
      if (this->use_int8_inference == true) {
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                  (&this->quantize_ops,(long)this->group);
        local_5f0 = (Mat *)&this->dequantize_ops;
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                  (&this->dequantize_ops,(long)this->group);
        if (0 < this->group) {
          lVar20 = 0;
          do {
            pLVar15 = create_layer(0x39);
            (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar20] = pLVar15;
            ParamDict::ParamDict((ParamDict *)local_548);
            ParamDict::set((ParamDict *)local_548,0,
                           *(float *)((long)(this->bottom_blob_int8_scales).data + lVar20 * 4));
            (*(this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar20]->_vptr_Layer[2])();
            lVar22 = 0x4d8;
            do {
              piVar6 = *(int **)(local_548 + lVar22 + 8);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (*(long **)(local_528 + lVar22 + -8) == (long *)0x0) {
                    if (*(long *)(local_548 + lVar22) != 0) {
                      free(*(void **)(*(long *)(local_548 + lVar22) + -8));
                    }
                  }
                  else {
                    (**(code **)(**(long **)(local_528 + lVar22 + -8) + 8))();
                  }
                }
              }
              *(undefined1 (*) [16])(local_548 + lVar22) = (undefined1  [16])0x0;
              *(undefined8 *)((long)&local_538 + lVar22) = 0;
              *(undefined8 *)((long)local_518 + lVar22) = 0;
              *(undefined1 (*) [16])(local_528 + lVar22) = (undefined1  [16])0x0;
              lVar22 = lVar22 + -0x40;
            } while (lVar22 != -0x28);
            lVar20 = lVar20 + 1;
          } while (lVar20 < this->group);
        }
        iVar12 = 0;
        if (0 < this->group) {
          lVar20 = 0;
          do {
            pLVar15 = create_layer(0x3a);
            (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar20] = pLVar15;
            fVar4 = *(float *)((long)(this->weight_data_int8_scales).data + lVar20 * 4);
            fVar5 = *(float *)((long)(this->bottom_blob_int8_scales).data + lVar20 * 4);
            ParamDict::ParamDict((ParamDict *)local_548);
            ParamDict::set((ParamDict *)local_548,0,1.0 / (fVar4 * fVar5));
            ParamDict::set((ParamDict *)local_548,1,this->bias_term);
            ParamDict::set((ParamDict *)local_548,2,1);
            pLVar15 = (((_Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                       &local_5f0->data)->_M_impl).super__Vector_impl_data._M_start[lVar20];
            (*pLVar15->_vptr_Layer[2])(pLVar15,(ParamDict *)local_548);
            local_628._16_8_ = (this->bias_data).elemsize;
            local_5d0 = (this->bias_data).allocator;
            local_628._0_8_ = local_628._16_8_ * lVar20 + (long)(this->bias_data).data;
            local_608._8_8_ = 0x100000001;
            local_608._0_8_ = 0x100000001;
            local_628._8_8_ = (int *)0x0;
            local_5f8 = 1;
            local_5e8.super_ModelBin._vptr_ModelBin = (_func_int **)0x0;
            local_5e8.weights = (Mat *)0x0;
            local_5d8 = 0;
            local_5b8 = 0;
            local_5c8 = (undefined1  [16])0x0;
            pLVar15 = (((_Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                       &local_5f0->data)->_M_impl).super__Vector_impl_data._M_start[lVar20];
            pAStack_610 = local_5d0;
            ModelBinFromMatArray::ModelBinFromMatArray(&local_5e8,(Mat *)local_628);
            (*pLVar15->_vptr_Layer[3])(pLVar15);
            if ((int *)local_628._8_8_ != (int *)0x0) {
              LOCK();
              *(int *)local_628._8_8_ = *(int *)local_628._8_8_ + -1;
              UNLOCK();
              if (*(int *)local_628._8_8_ == 0) {
                if (pAStack_610 == (Allocator *)0x0) {
                  if ((void *)local_628._0_8_ != (void *)0x0) {
                    free(*(void **)(local_628._0_8_ + -8));
                  }
                }
                else {
                  (**(code **)(*(long *)pAStack_610 + 8))();
                }
              }
            }
            local_628._0_16_ = (undefined1  [16])0x0;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = pAStack_610;
            stack0xfffffffffffff9e8 = auVar9 << 0x40;
            local_5f8 = 0;
            local_608 = (undefined1  [16])0x0;
            lVar22 = 0x4d8;
            do {
              piVar6 = *(int **)(local_548 + lVar22 + 8);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (*(long **)(local_528 + lVar22 + -8) == (long *)0x0) {
                    if (*(long *)(local_548 + lVar22) != 0) {
                      free(*(void **)(*(long *)(local_548 + lVar22) + -8));
                    }
                  }
                  else {
                    (**(code **)(**(long **)(local_528 + lVar22 + -8) + 8))();
                  }
                }
              }
              *(undefined1 (*) [16])(local_548 + lVar22) = (undefined1  [16])0x0;
              *(undefined8 *)((long)&local_538 + lVar22) = 0;
              *(undefined8 *)((long)local_518 + lVar22) = 0;
              *(undefined1 (*) [16])(local_528 + lVar22) = (undefined1  [16])0x0;
              lVar22 = lVar22 + -0x40;
            } while (lVar22 != -0x28);
            lVar20 = lVar20 + 1;
          } while (lVar20 < this->group);
          iVar12 = 0;
        }
      }
    }
  }
  return iVar12;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    if (int8_scale_term == 1)
    {
        weight_data_int8_scales = mb.load(group, 1);
        bottom_blob_int8_scales = mb.load(group, 1);
    }
    else if (int8_scale_term == 2)
    {
        weight_data_int8_scales = mb.load(1, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        // extend group if only one provided
        float weight_data_int8_scale = weight_data_int8_scales[0];
        weight_data_int8_scales = Mat(group);
        weight_data_int8_scales.fill(weight_data_int8_scale);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }

    for (int i=0; i<(int)quantize_ops.size(); i++)
        delete quantize_ops[i];

    quantize_ops.clear();

    for (int i=0; i<(int)dequantize_ops.size(); i++)
        delete dequantize_ops[i];

    dequantize_ops.clear();

    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    if (weight_data_is_float32 && use_int8_inference)
    {
        // quantize weight to int8
        Mat int8_weight_data(weight_data_size, (size_t)1u);
        if (int8_weight_data.empty())
            return -100;

        const int weight_data_size_g = weight_data_size / group;

        for (int g=0; g<group; g++)
        {
            Layer* op = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, weight_data_int8_scales[g]);// scale

            op->load_param(pd);

            ncnn::Option opt = ncnn::get_default_option();
            opt.blob_allocator = int8_weight_data.allocator;

            const Mat weight_data_g = weight_data.range(weight_data_size_g * g, weight_data_size_g);
            Mat int8_weight_data_g = int8_weight_data.range(weight_data_size_g * g, weight_data_size_g);
            op->forward(weight_data_g, int8_weight_data_g, opt);

            delete op;
        }

        weight_data = int8_weight_data;
    }

    if (use_int8_inference)
    {
        quantize_ops.resize(group);
        dequantize_ops.resize(group);

        for (int g=0; g<group; g++)
        {
            quantize_ops[g] = ncnn::create_layer(ncnn::LayerType::Quantize);

            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scales[g]);// scale

            quantize_ops[g]->load_param(pd);
        }

        for (int g=0; g<group; g++)
        {
            dequantize_ops[g] = ncnn::create_layer(ncnn::LayerType::Dequantize);

            float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);// bias_term
            pd.set(2, 1);// bias_data_size

            dequantize_ops[g]->load_param(pd);

            ncnn::Mat weights[1];
            weights[0] = bias_data.range(g, 1);

            dequantize_ops[g]->load_model(ModelBinFromMatArray(weights));
        }
    }

    return 0;
}